

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

int Ivy_FraigCheckOutputSims(Ivy_FraigMan_t *p)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  void *pvVar2;
  int i;
  Ivy_Obj_t *pObj;
  
  i = 0;
  do {
    p_00 = p->pManAig->vPos;
    if (p_00->nSize <= i) {
      return 0;
    }
    pvVar2 = Vec_PtrEntry(p_00,i);
    pObj = (Ivy_Obj_t *)(*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe);
    iVar1 = Ivy_NodeHasZeroSim(p,pObj);
    i = i + 1;
  } while (iVar1 != 0);
  Ivy_FraigCheckOutputSimsSavePattern(p,pObj);
  return 1;
}

Assistant:

int Ivy_FraigCheckOutputSims( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t * pObj;
    int i;
    // make sure the reference simulation pattern does not detect the bug
//    pObj = Ivy_ManPo( p->pManAig, 0 );
    Ivy_ManForEachPo( p->pManAig, pObj, i )
    {
        //assert( Ivy_ObjFanin0(pObj)->fPhase == (unsigned)Ivy_ObjFaninC0(pObj) ); // Ivy_ObjFaninPhase(Ivy_ObjChild0(pObj)) == 0
        // complement simulation info
//        if ( Ivy_ObjFanin0(pObj)->fPhase ^ Ivy_ObjFaninC0(pObj) ) // Ivy_ObjFaninPhase(Ivy_ObjChild0(pObj))
//            Ivy_NodeComplementSim( p, Ivy_ObjFanin0(pObj) );
        // check 
        if ( !Ivy_NodeHasZeroSim( p, Ivy_ObjFanin0(pObj) ) )
        {
            // create the counter-example from this pattern
            Ivy_FraigCheckOutputSimsSavePattern( p, Ivy_ObjFanin0(pObj) );
            return 1;
        }
        // complement simulation info
//        if ( Ivy_ObjFanin0(pObj)->fPhase ^ Ivy_ObjFaninC0(pObj) )
//            Ivy_NodeComplementSim( p, Ivy_ObjFanin0(pObj) );
    }
    return 0;
}